

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mkvmuxer.cc
# Opt level: O0

bool __thiscall
mkvmuxer::Projection::SetProjectionPrivate(Projection *this,uint8_t *data,uint64_t data_length)

{
  void *pvVar1;
  ulong in_RDX;
  void *in_RSI;
  long in_RDI;
  uint8_t *new_private_data;
  bool local_1;
  
  if ((in_RSI == (void *)0x0) || (in_RDX == 0)) {
    local_1 = false;
  }
  else {
    pvVar1 = operator_new__(in_RDX,(nothrow_t *)&std::nothrow);
    if (pvVar1 == (void *)0x0) {
      local_1 = false;
    }
    else {
      if (*(void **)(in_RDI + 0x10) != (void *)0x0) {
        operator_delete__(*(void **)(in_RDI + 0x10));
      }
      *(void **)(in_RDI + 0x10) = pvVar1;
      *(ulong *)(in_RDI + 0x18) = in_RDX;
      memcpy(*(void **)(in_RDI + 0x10),in_RSI,in_RDX);
      local_1 = true;
    }
  }
  return local_1;
}

Assistant:

bool Projection::SetProjectionPrivate(const uint8_t* data,
                                      uint64_t data_length) {
  if (data == NULL || data_length == 0) {
    return false;
  }

  if (data_length != static_cast<size_t>(data_length)) {
    return false;
  }

  uint8_t* new_private_data =
      new (std::nothrow) uint8_t[static_cast<size_t>(data_length)];
  if (new_private_data == NULL) {
    return false;
  }

  delete[] private_data_;
  private_data_ = new_private_data;
  private_data_length_ = data_length;
  memcpy(private_data_, data, static_cast<size_t>(data_length));

  return true;
}